

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffphprll(fitsfile *fptr,int simple,int bitpix,int naxis,LONGLONG *naxes,LONGLONG pcount,
            LONGLONG gcount,int extend,int *status)

{
  ulong uVar1;
  int iVar2;
  FITSfile *pFVar3;
  LONGLONG value;
  ulong uVar4;
  uint uVar5;
  char comm [73];
  long tnaxes [20];
  char name [75];
  char local_178 [15];
  uint uStack_169;
  undefined1 uStack_165;
  char acStack_164 [15];
  uint uStack_155;
  undefined2 uStack_151;
  undefined2 uStack_14f;
  undefined1 uStack_14d;
  long local_128 [20];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fptr->HDUposition;
  pFVar3 = fptr->Fptr;
  if (iVar2 != pFVar3->curhdu) {
    ffmahd(fptr,iVar2 + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
    iVar2 = pFVar3->curhdu;
  }
  if (pFVar3->headend != pFVar3->headstart[iVar2]) {
    *status = 0xc9;
    return 0xc9;
  }
  if ((naxis != 0) && (pFVar3->request_compress_type != 0)) {
    if (0 < naxis) {
      memcpy(local_128,naxes,(ulong)(uint)naxis << 3);
    }
    imcomp_init_table(fptr,bitpix,naxis,local_128,1,status);
    goto LAB_001a9209;
  }
  if (iVar2 == 0) {
    if (simple == 0) {
      uStack_165 = 0x72;
      builtin_strncpy(acStack_164,"m to FITS stand",0xf);
      builtin_strncpy(local_178 + 8,"s not c",7);
      uStack_169 = 0x6f666e6f;
      uStack_155 = 0x647261;
      simple = 0;
    }
    else {
      uStack_165 = 0x6f;
      builtin_strncpy(acStack_164," FITS standard",0xf);
      builtin_strncpy(local_178 + 8,"s confo",7);
      uStack_169 = 0x74206d72;
    }
    builtin_strncpy(local_178,"file doe",8);
    ffpkyl(fptr,"SIMPLE",simple,local_178,status);
  }
  else {
    builtin_strncpy(local_178,"IMAGE extension",0xf);
    uStack_169 = uStack_169 & 0xffffff00;
    ffpkys(fptr,"XTENSION","IMAGE",local_178,status);
  }
  if (bitpix == 0x14) {
    value = 0x10;
  }
  else if (bitpix == 0x50) {
    value = 0x40;
  }
  else if (bitpix == 0x28) {
    value = 0x20;
  }
  else {
    iVar2 = 8;
    if (bitpix != 10) {
      iVar2 = bitpix;
    }
    value = (LONGLONG)iVar2;
    if ((((0x38 < iVar2 - 8U) || ((0x100000001000101U >> ((ulong)(iVar2 - 8U) & 0x3f) & 1) == 0)) &&
        (iVar2 != -0x40)) && (iVar2 != -0x20)) {
      snprintf((char *)local_128,0x51,"Illegal value for BITPIX keyword: %d",(ulong)(uint)bitpix);
      ffpmsg((char *)local_128);
      *status = 0xd3;
      return 0xd3;
    }
  }
  uStack_165 = 100;
  builtin_strncpy(acStack_164,"ata pixel",10);
  builtin_strncpy(local_178,"number of bits ",0xf);
  uStack_169 = 0x20726570;
  iVar2 = ffpkyj(fptr,"BITPIX",value,local_178,status);
  if (0 < iVar2) goto LAB_001a9209;
  if (999 < (uint)naxis) {
    snprintf((char *)local_128,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
    ffpmsg((char *)local_128);
    *status = 0xd4;
    return 0xd4;
  }
  builtin_strncpy(local_178,"number of data ",0xf);
  uStack_169 = 0x73657861;
  uStack_165 = 0;
  ffpkyj(fptr,"NAXIS",(ulong)(uint)naxis,local_178,status);
  uStack_165 = 0x20;
  acStack_164[0] = '\0';
  builtin_strncpy(local_178,"length of data ",0xf);
  uStack_169 = 0x73697861;
  if (naxis != 0) {
    uVar4 = 0;
    do {
      if (naxes[uVar4] < 0) {
        snprintf((char *)local_128,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
                 SUB84((double)naxes[uVar4],0),(ulong)((int)uVar4 + 1));
        ffpmsg((char *)local_128);
        *status = 0xd5;
        return 0xd5;
      }
      uVar1 = uVar4 + 1;
      snprintf(acStack_164,0x35,"%d",uVar1 & 0xffffffff);
      ffkeyn("NAXIS",(int)uVar1,local_88,status);
      ffpkyj(fptr,local_88,naxes[uVar4],local_178,status);
      uVar4 = uVar1;
    } while ((uint)naxis != uVar1);
  }
  if (fptr->Fptr->curhdu == 0) {
    if (extend != 0) {
      uStack_165 = 0x6e;
      builtin_strncpy(acStack_164,"tain extensions",0xf);
      builtin_strncpy(local_178,"FITS dataset ma",0xf);
      uStack_169 = 0x6f632079;
      uStack_155 = uStack_155 & 0xffffff00;
      ffpkyl(fptr,"EXTEND",extend,local_178,status);
    }
    if (pcount < 0) {
      ffpmsg("pcount value is less than 0");
      *status = 0xd6;
      return 0xd6;
    }
    if (gcount < 1) {
      ffpmsg("gcount value is less than 1");
      *status = 0xd7;
      return 0xd7;
    }
    if (gcount != 1 || pcount != 0) {
      uStack_165 = 0x73;
      builtin_strncpy(acStack_164," are present",0xd);
      builtin_strncpy(local_178,"random group re",0xf);
      uStack_169 = 0x64726f63;
      ffpkyl(fptr,"GROUPS",1,local_178,status);
      builtin_strncpy(local_178,"number of rando",0xf);
      uStack_169 = 0x7267206d;
      uStack_165 = 0x6f;
      builtin_strncpy(acStack_164,"up parameters",0xe);
      ffpkyj(fptr,"PCOUNT",pcount,local_178,status);
      uStack_165 = 0x6f;
      builtin_strncpy(acStack_164,"ups",4);
      builtin_strncpy(local_178,"number of rando",0xf);
      uStack_169 = 0x7267206d;
LAB_001a9565:
      ffpkyj(fptr,"GCOUNT",gcount,local_178,status);
    }
  }
  else if (pcount == 0) {
    if (gcount == 1) {
      uStack_165 = 0x75;
      builtin_strncpy(acStack_164,"st = 0",7);
      builtin_strncpy(local_178,"required keywor",0xf);
      uStack_169 = 0x6d203b64;
      ffpkyj(fptr,"PCOUNT",0,local_178,status);
      builtin_strncpy(local_178,"required keywor",0xf);
      uStack_169 = 0x6d203b64;
      uStack_165 = 0x75;
      builtin_strncpy(acStack_164,"st = 1",7);
      gcount = 1;
      goto LAB_001a9565;
    }
    ffpmsg("image extensions must have gcount = 1");
    *status = 0xd7;
  }
  else {
    ffpmsg("image extensions must have pcount = 0");
    *status = 0xd6;
  }
  if (bitpix < 0x28) {
    if (bitpix == 10) {
      builtin_strncpy(acStack_164 + 8," signed",7);
      uStack_155 = 0x74796220;
      uStack_151 = 0x65;
      uVar5 = 0xc0600000;
    }
    else {
      if (bitpix != 0x14) goto LAB_001a9209;
      builtin_strncpy(acStack_164 + 8," unsign",7);
      uStack_155 = 0x73206465;
      uStack_151 = 0x6f68;
      uStack_14f = 0x7472;
      uStack_14d = 0;
      uVar5 = 0x40e00000;
    }
LAB_001a967a:
    uStack_169 = 0x74206567;
    builtin_strncpy(acStack_164," that of",8);
    uStack_165 = 0x6f;
    builtin_strncpy(local_178,"offset data ran",0xf);
    ffpkyg(fptr,"BZERO",(double)((ulong)uVar5 << 0x20),0,local_178,status);
  }
  else {
    if (bitpix == 0x28) {
      builtin_strncpy(acStack_164 + 8," unsign",7);
      uStack_155 = 0x6c206465;
      uStack_151 = 0x6e6f;
      uStack_14f = 0x67;
      uVar5 = 0x41e00000;
      goto LAB_001a967a;
    }
    if (bitpix != 0x50) goto LAB_001a9209;
    ffprec(fptr,"BZERO   =  9223372036854775808 / offset data range to that of unsigned long long",
           status);
  }
  builtin_strncpy(local_178,"default scaling",0xf);
  uStack_169 = 0x63616620;
  uStack_165 = 0x74;
  acStack_164[0] = 'o';
  acStack_164[1] = 0x72;
  acStack_164[2] = 0;
  ffpkyg(fptr,"BSCALE",1.0,0,local_178,status);
LAB_001a9209:
  return *status;
}

Assistant:

int ffphprll( fitsfile *fptr, /* I - FITS file pointer                        */
            int simple,     /* I - does file conform to FITS standard? 1/0  */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[], /* I - length of each data axis                 */
            LONGLONG pcount,  /* I - number of group parameters (usually 0)   */
            LONGLONG gcount,  /* I - number of random groups (usually 1 or 0) */
            int extend,     /* I - may FITS file have extensions?           */
            int *status)    /* IO - error status                            */
/*
  write required primary header keywords
*/
{
    int ii;
    long longbitpix, tnaxes[20];
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT], message[FLEN_ERRMSG];
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis != 0)   /* never try to compress a null image */
    {
      if ( (fptr->Fptr)->request_compress_type )
      {
      
       for (ii = 0; ii < naxis; ii++)
           tnaxes[ii] = (long) naxes[ii];
	   
        /* write header for a compressed image */
        imcomp_init_table(fptr, bitpix, naxis, tnaxes, 1, status);
        return(*status);
      }
    }  

    if ((fptr->Fptr)->curhdu == 0)
    {                /* write primary array header */
        if (simple)
            strcpy(comm, "file does conform to FITS standard");
        else
            strcpy(comm, "file does not conform to FITS standard");

        ffpkyl(fptr, "SIMPLE", simple, comm, status);
    }
    else
    {               /* write IMAGE extension header */
        strcpy(comm, "IMAGE extension");
        ffpkys(fptr, "XTENSION", "IMAGE", comm, status);
    }

    longbitpix = bitpix;

    /* test for the 3 special cases that represent unsigned integers */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    strcpy(comm, "number of bits per data pixel");
    if (ffpkyj(fptr, "BITPIX", longbitpix, comm, status) > 0)
        return(*status);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    strcpy(comm, "number of data axes");
    ffpkyj(fptr, "NAXIS", naxis, comm, status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], FLEN_COMMENT-20,"%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }

    if ((fptr->Fptr)->curhdu == 0)  /* the primary array */
    {
        if (extend)
        {
            /* only write EXTEND keyword if value = true */
            strcpy(comm, "FITS dataset may contain extensions");
            ffpkyl(fptr, "EXTEND", extend, comm, status);
        }

        if (pcount < 0)
        {
            ffpmsg("pcount value is less than 0");
            return(*status = BAD_PCOUNT);
        }

        else if (gcount < 1)
        {
            ffpmsg("gcount value is less than 1");
            return(*status = BAD_GCOUNT);
        }

        else if (pcount > 0 || gcount > 1)
        {
            /* only write these keyword if non-standard values */
            strcpy(comm, "random group records are present");
            ffpkyl(fptr, "GROUPS", 1, comm, status);

            strcpy(comm, "number of random group parameters");
            ffpkyj(fptr, "PCOUNT", pcount, comm, status);
  
            strcpy(comm, "number of random groups");
            ffpkyj(fptr, "GCOUNT", gcount, comm, status);
        }

      /* write standard block of self-documentating comments */
/*    ffprec(fptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(fptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status); */
    }

    else  /* an IMAGE extension */

    {   /* image extension; cannot have random groups */
        if (pcount != 0)
        {
            ffpmsg("image extensions must have pcount = 0");
            *status = BAD_PCOUNT;
        }

        else if (gcount != 1)
        {
            ffpmsg("image extensions must have gcount = 1");
            *status = BAD_GCOUNT;
        }

        else
        {
            strcpy(comm, "required keyword; must = 0");
            ffpkyj(fptr, "PCOUNT", 0, comm, status);
  
            strcpy(comm, "required keyword; must = 1");
            ffpkyj(fptr, "GCOUNT", 1, comm, status);
        }
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(fptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(fptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(card,"BZERO   =  9223372036854775808 / offset data range to that of unsigned long long");
        ffprec(fptr, card, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(fptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    return(*status);
}